

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGenericDiagonalMass.cpp
# Opt level: O3

ChVariablesGenericDiagonalMass * __thiscall
chrono::ChVariablesGenericDiagonalMass::operator=
          (ChVariablesGenericDiagonalMass *this,ChVariablesGenericDiagonalMass *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong rows;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Index index;
  ulong uVar12;
  long lVar13;
  Index size;
  
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    pdVar3 = (other->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    rows = (other->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
    if ((this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 rows,1);
      if ((this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows != rows) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar4 = (this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar12 = rows + 7;
    if (-1 < (long)rows) {
      uVar12 = rows;
    }
    uVar12 = uVar12 & 0xfffffffffffffff8;
    if (7 < (long)rows) {
      lVar13 = 0;
      do {
        pdVar1 = pdVar3 + lVar13;
        dVar5 = pdVar1[1];
        dVar6 = pdVar1[2];
        dVar7 = pdVar1[3];
        dVar8 = pdVar1[4];
        dVar9 = pdVar1[5];
        dVar10 = pdVar1[6];
        dVar11 = pdVar1[7];
        pdVar2 = pdVar4 + lVar13;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar5;
        pdVar2[2] = dVar6;
        pdVar2[3] = dVar7;
        pdVar2[4] = dVar8;
        pdVar2[5] = dVar9;
        pdVar2[6] = dVar10;
        pdVar2[7] = dVar11;
        lVar13 = lVar13 + 8;
      } while (lVar13 < (long)uVar12);
    }
    if ((long)uVar12 < (long)rows) {
      do {
        pdVar4[uVar12] = pdVar3[uVar12];
        uVar12 = uVar12 + 1;
      } while (rows != uVar12);
    }
  }
  return this;
}

Assistant:

ChVariablesGenericDiagonalMass& ChVariablesGenericDiagonalMass::operator=(const ChVariablesGenericDiagonalMass& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    MmassDiag = other.MmassDiag;

    return *this;
}